

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanlineAdapterTests.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
agge::tests::ScanlineAdapterTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ScanlineAdapterTests.cpp"
             ,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"28",&local_89);
  std::operator+(local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ScanlineAdapterTests",&local_b1);
  std::operator+(in_RDI,local_30);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

test( ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction )
			{
				// INIT
				mocks::renderer_adapter<> r1;
				raw_memory_object b1;

				mocks::renderer_adapter<uint16_t> r2;
				raw_memory_object b2;

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl1(r1, b1, 11);
				scanline_adapter< mocks::renderer_adapter<uint16_t> > sl2(r2, b2, 17);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 11 + 4));
				assert_is_true(enough_capacity<uint16_t>(b2, 17 + 4));

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl3(r1, b1, 1311);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 1311 + 4));
			}